

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O0

void lts2::SoftThresholding(Mat *X1,Mat *X2,float threshold)

{
  float fVar1;
  int local_34;
  float absX;
  int x;
  float *p_x2;
  float *p_x1;
  int y;
  float threshold_local;
  Mat *X2_local;
  Mat *X1_local;
  
  for (p_x1._0_4_ = 0; (int)p_x1 < *(int *)(X1 + 8); p_x1._0_4_ = (int)p_x1 + 1) {
    p_x2 = cv::Mat::ptr<float>(X1,(int)p_x1);
    _absX = cv::Mat::ptr<float>(X2,(int)p_x1);
    for (local_34 = 0; local_34 < *(int *)(X1 + 0xc); local_34 = local_34 + 1) {
      fVar1 = hypotf(*p_x2,*_absX);
      if (1e-06 <= fVar1) {
        *p_x2 = *p_x2 / fVar1;
        *_absX = *_absX / fVar1;
        fVar1 = fVar1 - threshold;
        if (fVar1 <= 0.0) {
          *p_x2 = 0.0;
          *_absX = 0.0;
        }
        else {
          *p_x2 = fVar1 * *p_x2;
          *_absX = fVar1 * *_absX;
        }
      }
      else {
        *p_x2 = 0.0;
        *_absX = 0.0;
      }
      p_x2 = p_x2 + 1;
      _absX = _absX + 1;
    }
  }
  return;
}

Assistant:

void lts2::SoftThresholding(cv::Mat &X1, cv::Mat &X2, float threshold)
{
  for (int y = 0; y < X1.rows; ++y)
  {
    float* p_x1 = X1.ptr<float>(y);
    float* p_x2 = X2.ptr<float>(y);
        
    for (int x = 0; x < X1.cols; ++x, ++p_x1, ++p_x2)
    {
      float absX = hypotf(*p_x1, *p_x2);
            
      if ( absX < 1e-6 )
      {
        *p_x1 = 0.0;
        *p_x2 = 0.0;
      }
      else 
      {
        *p_x1 /= absX;
        *p_x2 /= absX;

        absX -= threshold;
                
        if ( absX > 0.0 )
        {
          *p_x1 *= absX;
          *p_x2 *= absX;
        }
        else
        {
          *p_x1 = 0.0;
          *p_x2 = 0.0;
        }
      }
    }
  }
}